

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack19_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x7ffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x13;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0x3f) << 0xd | *puVar1;
  out[2] = *puVar2 >> 6 & 0x7ffff;
  puVar1 = out + 3;
  *puVar1 = *puVar2 >> 0x19;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0xfff) << 7 | *puVar1;
  out[4] = *puVar2 >> 0xc & 0x7ffff;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 0x1f;
  *puVar1 = (in[3] & 0x3ffff) << 1 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[3] >> 0x12;
  *puVar1 = (in[4] & 0x1f) << 0xe | *puVar1;
  out[7] = in[4] >> 5 & 0x7ffff;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack19_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 6)) << (19 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 19);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 12)) << (19 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 19);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 18)) << (19 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 5)) << (19 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 19);
  out++;

  return in + 1;
}